

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::LogButtons(void)

{
  int *v;
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ImVec2 local_30;
  
  pIVar1 = GImGui;
  PushID("LogButtons");
  local_30.x = 0.0;
  local_30.y = 0.0;
  bVar2 = Button("Log To TTY",&local_30);
  SameLine(0.0,-1.0);
  local_30.x = 0.0;
  local_30.y = 0.0;
  bVar3 = Button("Log To File",&local_30);
  SameLine(0.0,-1.0);
  local_30.x = 0.0;
  local_30.y = 0.0;
  bVar4 = Button("Log To Clipboard",&local_30);
  SameLine(0.0,-1.0);
  PushItemWidth(80.0);
  PushAllowKeyboardFocus(false);
  v = &pIVar1->LogAutoExpandMaxDepth;
  SliderInt("Depth",v,0,9,(char *)0x0);
  PopAllowKeyboardFocus();
  PopItemWidth();
  PopID();
  if (bVar2) {
    LogToTTY(*v);
  }
  if (bVar3) {
    LogToFile(pIVar1->LogAutoExpandMaxDepth,(pIVar1->IO).LogFilename);
  }
  if (bVar4) {
    LogToClipboard(*v);
    return;
  }
  return;
}

Assistant:

void ImGui::LogButtons()
{
    ImGuiContext& g = *GImGui;

    PushID("LogButtons");
    const bool log_to_tty = Button("Log To TTY"); SameLine();
    const bool log_to_file = Button("Log To File"); SameLine();
    const bool log_to_clipboard = Button("Log To Clipboard"); SameLine();
    PushItemWidth(80.0f);
    PushAllowKeyboardFocus(false);
    SliderInt("Depth", &g.LogAutoExpandMaxDepth, 0, 9, NULL);
    PopAllowKeyboardFocus();
    PopItemWidth();
    PopID();

    // Start logging at the end of the function so that the buttons don't appear in the log
    if (log_to_tty)
        LogToTTY(g.LogAutoExpandMaxDepth);
    if (log_to_file)
        LogToFile(g.LogAutoExpandMaxDepth, g.IO.LogFilename);
    if (log_to_clipboard)
        LogToClipboard(g.LogAutoExpandMaxDepth);
}